

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

char * getLinkInterfaceDependentProperty<char_const*>
                 (cmTarget *tgt,string *prop,string *config,CompatibleType t,char **param_5)

{
  char *pcVar1;
  
  switch(t) {
  case BoolType:
    __assert_fail("0 && \"String compatibility check function called for boolean\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                  ,0x1930,
                  "const char *getLinkInterfaceDependentProperty(const cmTarget *, const std::string &, const std::string &, CompatibleType, const char **)"
                 );
  case StringType:
    pcVar1 = cmTarget::GetLinkInterfaceDependentStringProperty(tgt,prop,config);
    return pcVar1;
  case NumberMinType:
    pcVar1 = cmTarget::GetLinkInterfaceDependentNumberMinProperty(tgt,prop,config);
    return pcVar1;
  case NumberMaxType:
    pcVar1 = cmTarget::GetLinkInterfaceDependentNumberMaxProperty(tgt,prop,config);
    return pcVar1;
  default:
    __assert_fail("0 && \"Unreachable!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                  ,0x1939,
                  "const char *getLinkInterfaceDependentProperty(const cmTarget *, const std::string &, const std::string &, CompatibleType, const char **)"
                 );
  }
}

Assistant:

const char * getLinkInterfaceDependentProperty(cmTarget const* tgt,
                                               const std::string& prop,
                                               const std::string& config,
                                               CompatibleType t,
                                               const char **)
{
  switch(t)
  {
  case BoolType:
    assert(0 && "String compatibility check function called for boolean");
    return 0;
  case StringType:
    return tgt->GetLinkInterfaceDependentStringProperty(prop, config);
  case NumberMinType:
    return tgt->GetLinkInterfaceDependentNumberMinProperty(prop, config);
  case NumberMaxType:
    return tgt->GetLinkInterfaceDependentNumberMaxProperty(prop, config);
  }
  assert(0 && "Unreachable!");
  return 0;
}